

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

_Bool auth_digest_get_key_value(char *chlg,char *key,char *value,size_t max_val_len,char end_char)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  
  pcVar2 = strstr(chlg,key);
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(key);
    for (uVar4 = 0;
        ((cVar1 = pcVar2[uVar4 + sVar3], cVar1 != '\0' && (cVar1 != end_char)) &&
        (uVar4 < max_val_len - 1)); uVar4 = uVar4 + 1) {
      value[uVar4] = cVar1;
    }
    value[uVar4] = '\0';
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

static bool auth_digest_get_key_value(const char *chlg,
                                      const char *key,
                                      char *value,
                                      size_t max_val_len,
                                      char end_char)
{
  char *find_pos;
  size_t i;

  find_pos = strstr(chlg, key);
  if(!find_pos)
    return FALSE;

  find_pos += strlen(key);

  for(i = 0; *find_pos && *find_pos != end_char && i < max_val_len - 1; ++i)
    value[i] = *find_pos++;
  value[i] = '\0';

  return TRUE;
}